

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

int libssh2_channel_request_auth_agent(LIBSSH2_CHANNEL *channel)

{
  int iVar1;
  time_t tVar2;
  libssh2_nonblocking_states lVar3;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  lVar3 = channel->req_auth_agent_try_state;
  iVar1 = -0x17;
  if (lVar3 == libssh2_NB_state_idle) {
    tVar2 = time((time_t *)0x0);
    do {
      iVar1 = channel_request_auth_agent(channel,"auth-agent-req@openssh.com",0x1a);
      if (iVar1 != -0x25) break;
      if (channel->session->api_block_mode == 0) {
        iVar1 = -0x25;
        goto LAB_0010a669;
      }
      iVar1 = _libssh2_wait_socket(channel->session,tVar2);
    } while (iVar1 == 0);
    if ((iVar1 == -0x25) || (iVar1 == 0)) {
LAB_0010a669:
      lVar3 = channel->req_auth_agent_try_state;
      goto LAB_0010a66f;
    }
    channel->req_auth_agent_try_state = libssh2_NB_state_sent;
LAB_0010a674:
    tVar2 = time((time_t *)0x0);
    do {
      iVar1 = channel_request_auth_agent(channel,"auth-agent-req",0xe);
      if (iVar1 != -0x25) break;
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar1 = _libssh2_wait_socket(channel->session,tVar2);
    } while (iVar1 == 0);
    if ((iVar1 != 0) && (lVar3 = libssh2_NB_state_sent1, iVar1 != -0x25)) goto LAB_0010a6c9;
  }
  else {
LAB_0010a66f:
    if (lVar3 == libssh2_NB_state_sent) goto LAB_0010a674;
  }
  if (iVar1 != 0) {
    return iVar1;
  }
  lVar3 = libssh2_NB_state_idle;
  iVar1 = 0;
LAB_0010a6c9:
  channel->req_auth_agent_try_state = lVar3;
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_channel_request_auth_agent(LIBSSH2_CHANNEL *channel)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    rc = LIBSSH2_ERROR_CHANNEL_UNKNOWN;

    /* The current RFC draft for agent forwarding says you're supposed to
     * send "auth-agent-req," but most SSH servers out there right now
     * actually expect "auth-agent-req@openssh.com", so we try that
     * first. */
    if(channel->req_auth_agent_try_state == libssh2_NB_state_idle) {
        BLOCK_ADJUST(rc, channel->session,
                     channel_request_auth_agent(channel,
                                                "auth-agent-req@openssh.com",
                                                26));

        /* If we failed (but not with EAGAIN), then we move onto
         * the next step to try another request type. */
        if(rc != LIBSSH2_ERROR_NONE &&
           rc != LIBSSH2_ERROR_EAGAIN)
            channel->req_auth_agent_try_state = libssh2_NB_state_sent;
    }

    if(channel->req_auth_agent_try_state == libssh2_NB_state_sent) {
        BLOCK_ADJUST(rc, channel->session,
                     channel_request_auth_agent(channel,
                                                "auth-agent-req", 14));

        /* If we failed without an EAGAIN, then move on with this
         * state machine. */
        if(rc != LIBSSH2_ERROR_NONE &&
           rc != LIBSSH2_ERROR_EAGAIN)
            channel->req_auth_agent_try_state = libssh2_NB_state_sent1;
    }

    /* If things are good, reset the try state. */
    if(rc == LIBSSH2_ERROR_NONE)
        channel->req_auth_agent_try_state = libssh2_NB_state_idle;

    return rc;
}